

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O0

void splice_vector<std::vector<unsigned_int,std::allocator<unsigned_int>>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *vector,uint32_t splice_start,
               uint32_t deletion_size,const_iterator inserted_begin,const_iterator inserted_end)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  size_type sVar2;
  ulong uVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c8;
  uint *local_c0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b0;
  uint *local_a8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a0;
  uint *local_98;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_88;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_80;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  uint *local_70;
  uint *local_68;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  long local_40;
  int64_t size_delta;
  uint32_t deletion_end;
  uint32_t insertion_end;
  uint32_t insertion_size;
  uint32_t original_size;
  uint32_t deletion_size_local;
  uint32_t splice_start_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vector_local;
  const_iterator inserted_end_local;
  const_iterator inserted_begin_local;
  
  insertion_size = deletion_size;
  original_size = splice_start;
  _deletion_size_local = vector;
  vector_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)inserted_end._M_current;
  inserted_end_local = inserted_begin;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(vector);
  insertion_end = (uint32_t)sVar2;
  uVar3 = __gnu_cxx::operator-
                    ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&vector_local,&inserted_end_local);
  pvVar1 = _deletion_size_local;
  deletion_end = (uint32_t)uVar3;
  size_delta._4_4_ = original_size + deletion_end;
  size_delta._0_4_ = original_size + insertion_size;
  local_40 = (uVar3 & 0xffffffff) - (ulong)insertion_size;
  if (0 < local_40) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_deletion_size_local);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(pvVar1,sVar2 + local_40);
  }
  if ((size_delta._4_4_ < (uint)size_delta) || (insertion_end <= size_delta._4_4_)) {
    local_80._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin
                           (_deletion_size_local);
    local_78 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator+(&local_80,(ulong)(uint)size_delta);
    local_90._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin
                           (_deletion_size_local);
    local_88 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator+(&local_90,(ulong)insertion_end);
    local_a0._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (_deletion_size_local);
    local_98 = (uint *)__gnu_cxx::
                       __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       ::operator+(&local_a0,(ulong)size_delta._4_4_);
    local_a8 = (uint *)std::
                       copy<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                                 (local_78,local_88,
                                  (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   )local_98);
  }
  else {
    local_50._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin
                           (_deletion_size_local);
    local_48 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator+(&local_50,(ulong)(uint)size_delta);
    local_60._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin
                           (_deletion_size_local);
    local_58 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator+(&local_60,(ulong)insertion_end);
    local_68 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 (_deletion_size_local);
    local_70 = (uint *)std::
                       copy_backward<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                                 (local_48,local_58,
                                  (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   )local_68);
  }
  local_b0._M_current = inserted_end_local._M_current;
  local_b8._M_current = (uint *)vector_local;
  local_c8._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(_deletion_size_local)
  ;
  local_c0 = (uint *)__gnu_cxx::
                     __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator+(&local_c8,(ulong)original_size);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (local_b0,local_b8,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_c0);
  pvVar1 = _deletion_size_local;
  if (local_40 < 0) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_deletion_size_local);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(pvVar1,sVar2 + local_40);
  }
  return;
}

Assistant:

void splice_vector(
  T &vector, uint32_t splice_start, uint32_t deletion_size,
  typename T::const_iterator inserted_begin,
  typename T::const_iterator inserted_end
) {
  uint32_t original_size = vector.size();
  uint32_t insertion_size = inserted_end - inserted_begin;
  uint32_t insertion_end = splice_start + insertion_size;
  uint32_t deletion_end = splice_start + deletion_size;
  int64_t size_delta = static_cast<int64_t>(insertion_size) - deletion_size;

  if (size_delta > 0) {
    vector.resize(vector.size() + size_delta);
  }

  if (insertion_end >= deletion_end && insertion_end < original_size) {
    std::copy_backward(
      vector.cbegin() + deletion_end,
      vector.cbegin() + original_size,
      vector.end()
    );
  } else {
    std::copy(
      vector.cbegin() + deletion_end,
      vector.cbegin() + original_size,
      vector.begin() + insertion_end
    );
  }

  std::copy(
    inserted_begin,
    inserted_end,
    vector.begin() + splice_start
  );

  if (size_delta < 0) {
    vector.resize(vector.size() + size_delta);
  }
}